

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

optional<std::pair<const_char_*,_unsigned_long>_> * __thiscall
std::experimental::optional<std::pair<const_char_*,_unsigned_long>_>::operator=
          (optional<std::pair<const_char_*,_unsigned_long>_> *this,
          optional<std::pair<const_char_*,_unsigned_long>_> *rhs)

{
  bool bVar1;
  pair<const_char_*,_unsigned_long> *ppVar2;
  
  bVar1 = (rhs->super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>).init_;
  if ((this->super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>).init_ == true) {
    if (bVar1 == false) {
      (this->super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>).init_ = false;
    }
    else {
      ppVar2 = operator*(rhs);
      (this->super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>).storage_.value_.first =
           ppVar2->first;
      (this->super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>).storage_.value_.second =
           ppVar2->second;
    }
  }
  else if (bVar1 != false) {
    ppVar2 = operator*(rhs);
    optional<std::pair<char_const*,unsigned_long>>::initialize<std::pair<char_const*,unsigned_long>>
              ((optional<std::pair<char_const*,unsigned_long>> *)this,ppVar2);
  }
  return this;
}

Assistant:

optional& operator=(optional&& rhs)
  noexcept(is_nothrow_move_assignable<T>::value && is_nothrow_move_constructible<T>::value)
  {
    if      (initialized() == true  && rhs.initialized() == false) clear();
    else if (initialized() == false && rhs.initialized() == true)  initialize(std::move(*rhs));
    else if (initialized() == true  && rhs.initialized() == true)  contained_val() = std::move(*rhs);
    return *this;
  }